

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall Lexer::isHexNumber(Lexer *this,string *token,Type *type)

{
  bool bVar1;
  char *pcVar2;
  string local_50 [32];
  size_t local_30;
  size_t marker;
  Type *type_local;
  string *token_local;
  Lexer *this_local;
  
  if (((((this->_enableHexNumber & 1U) != 0) &&
       (local_30 = this->_cursor, 2 < this->_eos - local_30)) &&
      (marker = (size_t)type, type_local = (Type *)token, token_local = &this->_text,
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 == '0')) &&
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 == 'x')) {
    local_30 = local_30 + 2;
    while( true ) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      bVar1 = unicodeHexDigit((int)*pcVar2);
      if (!bVar1) break;
      local_30 = local_30 + 1;
    }
    if (2 < local_30 - this->_cursor) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)type_local,local_50);
      std::__cxx11::string::~string(local_50);
      *(undefined4 *)marker = 2;
      this->_cursor = local_30;
      return true;
    }
  }
  return false;
}

Assistant:

bool Lexer::isHexNumber (std::string& token, Lexer::Type& type)
{
  if (_enableHexNumber)
  {
    std::size_t marker = _cursor;

    if (_eos - marker >= 3 &&
        _text[marker + 0] == '0' &&
        _text[marker + 1] == 'x')
    {
      marker += 2;

      while (unicodeHexDigit (_text[marker]))
        ++marker;

      if (marker - _cursor > 2)
      {
        token = _text.substr (_cursor, marker - _cursor);
        type = Lexer::Type::hex;
        _cursor = marker;
        return true;
      }
    }
  }

  return false;
}